

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemoryRegionSection *
address_space_translate_internal
          (AddressSpaceDispatch *d,hwaddr addr,hwaddr *xlat,hwaddr *plen,_Bool resolve_subpage)

{
  ulong uVar1;
  MemoryRegionSection *pMVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  pMVar2 = d->mru_section;
  if (((pMVar2 == (MemoryRegionSection *)0x0) || (pMVar2 == (d->map).sections)) ||
     ((*(long *)((long)&pMVar2->size + 8) == 0 &&
      ((addr < pMVar2->offset_within_address_space ||
       ((pMVar2->offset_within_address_space + (long)pMVar2->size) - 1 < addr)))))) {
    pMVar2 = phys_page_find(d,addr);
    d->mru_section = pMVar2;
  }
  if ((resolve_subpage) && (pMVar2->mr->subpage == true)) {
    pMVar2 = (d->map).sections +
             *(ushort *)((long)&pMVar2->mr[1].ops + (ulong)((uint)addr & 0x3fff) * 2);
  }
  uVar6 = addr - pMVar2->offset_within_address_space;
  *xlat = pMVar2->offset_within_region + uVar6;
  if (pMVar2->mr->ram == true) {
    uVar1 = (ulong)pMVar2->size;
    uVar3 = uVar1 - uVar6;
    lVar4 = *(long *)((long)&pMVar2->size + 8) - (ulong)(uVar1 < uVar6);
    uVar6 = *plen;
    lVar5 = 0;
    if (lVar4 < (long)(ulong)(uVar3 < uVar6)) {
      lVar5 = lVar4;
      uVar6 = uVar3;
    }
    if (lVar5 != 0) {
      __assert_fail("r == a",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                    ,0x16,"uint64_t int128_get64(Int128)");
    }
    *plen = uVar6;
  }
  return pMVar2;
}

Assistant:

static MemoryRegionSection *
address_space_translate_internal(AddressSpaceDispatch *d, hwaddr addr, hwaddr *xlat,
                                 hwaddr *plen, bool resolve_subpage)
{
    MemoryRegionSection *section;
    MemoryRegion *mr;
    Int128 diff;

    section = address_space_lookup_region(d, addr, resolve_subpage);
    /* Compute offset within MemoryRegionSection */
    addr -= section->offset_within_address_space;

    /* Compute offset within MemoryRegion */
    *xlat = addr + section->offset_within_region;

    mr = section->mr;

    /* MMIO registers can be expected to perform full-width accesses based only
     * on their address, without considering adjacent registers that could
     * decode to completely different MemoryRegions.  When such registers
     * exist (e.g. I/O ports 0xcf8 and 0xcf9 on most PC chipsets), MMIO
     * regions overlap wildly.  For this reason we cannot clamp the accesses
     * here.
     *
     * If the length is small (as is the case for address_space_ldl/stl),
     * everything works fine.  If the incoming length is large, however,
     * the caller really has to do the clamping through memory_access_size.
     */
    if (memory_region_is_ram(mr)) {
        diff = int128_sub(section->size, int128_make64(addr));
        *plen = int128_get64(int128_min(diff, int128_make64(*plen)));
    }
    return section;
}